

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.h
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::UserEntryLess::operator()
          (UserEntryLess *this,UserEntry *lhs,UserEntry *rhs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  UserEntry *rhs_local;
  UserEntry *lhs_local;
  UserEntryLess *this_local;
  
  if ((lhs->def == (Instruction *)0x0) && (rhs->def != (Instruction *)0x0)) {
    this_local._7_1_ = true;
  }
  else if ((lhs->def == (Instruction *)0x0) || (rhs->def != (Instruction *)0x0)) {
    if ((lhs->def != (Instruction *)0x0) && (rhs->def != (Instruction *)0x0)) {
      uVar1 = opt::Instruction::unique_id(lhs->def);
      uVar2 = opt::Instruction::unique_id(rhs->def);
      if (uVar1 < uVar2) {
        return true;
      }
      uVar1 = opt::Instruction::unique_id(rhs->def);
      uVar2 = opt::Instruction::unique_id(lhs->def);
      if (uVar1 < uVar2) {
        return false;
      }
    }
    if ((lhs->user == (Instruction *)0x0) && (rhs->user == (Instruction *)0x0)) {
      this_local._7_1_ = false;
    }
    else if (lhs->user == (Instruction *)0x0) {
      this_local._7_1_ = true;
    }
    else if (rhs->user == (Instruction *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      uVar1 = opt::Instruction::unique_id(lhs->user);
      uVar2 = opt::Instruction::unique_id(rhs->user);
      this_local._7_1_ = uVar1 < uVar2;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const UserEntry& lhs, const UserEntry& rhs) const {
    // If lhs.def and rhs.def are both null, fall through to checking the
    // second entries.
    if (!lhs.def && rhs.def) return true;
    if (lhs.def && !rhs.def) return false;

    // If neither definition is null, then compare unique ids.
    if (lhs.def && rhs.def) {
      if (lhs.def->unique_id() < rhs.def->unique_id()) return true;
      if (rhs.def->unique_id() < lhs.def->unique_id()) return false;
    }

    // Return false on equality.
    if (!lhs.user && !rhs.user) return false;
    if (!lhs.user) return true;
    if (!rhs.user) return false;

    // If neither user is null then compare unique ids.
    return lhs.user->unique_id() < rhs.user->unique_id();
  }